

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

size_t __thiscall slang::SourceManager::getColumnNumber(SourceManager *this,SourceLocation location)

{
  char cVar1;
  pointer pvVar2;
  long lVar3;
  pointer pvVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  if (((ulong)location & 0xfffffff) != 0) {
    uVar6 = (ulong)(location._0_4_ & 0xfffffff);
    pvVar2 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar6 < (ulong)((long)(this->bufferEntries).
                              super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 6)) {
      pvVar4 = (pointer)0x0;
      if (*(__index_type *)
           ((long)&pvVar2[uVar6].
                   super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                   .
                   super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
           + 0x38) == '\0') {
        pvVar4 = pvVar2 + uVar6;
      }
      goto LAB_0031be71;
    }
  }
  pvVar4 = (pointer)0x0;
LAB_0031be71:
  if ((pvVar4 == (pointer)0x0) ||
     (lVar3 = *(long *)&(pvVar4->
                        super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                        ).
                        super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                        .
                        super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
     , lVar3 == 0)) {
    sVar7 = 0;
  }
  else {
    lVar5 = ((ulong)location >> 0x1c) + 1;
    while (lVar5 != 1) {
      cVar1 = *(char *)(*(long *)(lVar3 + 0x20) + -2 + lVar5);
      lVar5 = lVar5 + -1;
      if ((cVar1 == '\r') || (cVar1 == '\n')) goto LAB_0031beaa;
    }
    lVar5 = 0;
LAB_0031beaa:
    sVar7 = (((ulong)location >> 0x1c) - lVar5) + 1;
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return sVar7;
}

Assistant:

size_t SourceManager::getColumnNumber(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(location.buffer(), lock);
    if (!info || !info->data)
        return 0;

    // walk backward to find start of line
    auto fd = info->data;
    size_t lineStart = location.offset();
    SLANG_ASSERT(lineStart < fd->mem.size());
    while (lineStart > 0 && fd->mem[lineStart - 1] != '\n' && fd->mem[lineStart - 1] != '\r')
        lineStart--;

    return location.offset() - lineStart + 1;
}